

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

bool __thiscall Diligent::DeviceObjectArchive::Deserialize(DeviceObjectArchive *this,CreateInfo *CI)

{
  NamedResourceKey *this_00;
  undefined *puVar1;
  bool bVar2;
  undefined8 uVar3;
  void *pData;
  size_t Size;
  Char *Message;
  mapped_type *ResData_00;
  iterator pvVar4;
  char (*Args_1) [16];
  char (*in_R8) [3];
  uint *in_R9;
  char *in_stack_fffffffffffffc38;
  DataBlobImpl *local_2e8;
  undefined1 local_2d0 [8];
  string _msg_12;
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *Shaders;
  iterator __end1;
  iterator __begin1;
  array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  *__range1;
  string _msg_11;
  ResourceData *ResData;
  undefined1 local_248 [7];
  bool MakeNameCopy;
  string msg;
  undefined1 local_220 [8];
  string _msg_10;
  char *pcStack_1f8;
  ResourceType ResType;
  char *Name;
  undefined1 local_1e8 [4];
  Uint32 res;
  string _msg_9;
  undefined1 local_1c0 [4];
  Uint32 NumResources;
  string _msg_8;
  string _msg_7;
  undefined1 local_170 [8];
  string _msg_6;
  string _msg_5;
  undefined1 local_128 [8];
  string _msg_4;
  string _msg_3;
  string _msg_2;
  string _msg_1;
  ArchiveHeader Header;
  ArchiveSerializer<(Diligent::SerializerMode)0> ArchiveReader;
  undefined1 local_68 [8];
  Serializer<(Diligent::SerializerMode)0> Reader;
  RefCntAutoPtr<Diligent::DataBlobImpl> local_48;
  undefined1 local_40 [8];
  string _msg;
  CreateInfo *CI_local;
  DeviceObjectArchive *this_local;
  
  _msg.field_2._8_8_ = CI;
  Clear(this);
  if (*(long *)_msg.field_2._8_8_ == 0) {
    FormatString<char[23]>((string *)local_40,(char (*) [23])"pData must not be null");
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar3,0);
    }
    std::__cxx11::string::~string((string *)local_40);
    Clear(this);
    this_local._7_1_ = false;
  }
  else {
    Reader.m_Ptr._7_1_ = 0;
    if ((*(byte *)(_msg.field_2._8_8_ + 0xc) & 1) == 0) {
      local_2e8 = *(DataBlobImpl **)_msg.field_2._8_8_;
    }
    else {
      DataBlobImpl::MakeCopy((DataBlobImpl *)&local_48,*(IDataBlob **)_msg.field_2._8_8_);
      Reader.m_Ptr._7_1_ = 1;
      local_2e8 = Diligent::RefCntAutoPtr::operator_cast_to_DataBlobImpl_
                            ((RefCntAutoPtr *)&local_48);
    }
    RefCntAutoPtr<Diligent::IDataBlob>::operator=(&this->m_pArchiveData,(IDataBlob *)local_2e8);
    if ((Reader.m_Ptr._7_1_ & 1) != 0) {
      RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr(&local_48);
    }
    pData = (void *)(**(code **)(**(long **)_msg.field_2._8_8_ + 0x38))
                              (*(long **)_msg.field_2._8_8_,0);
    Size = (**(code **)(**(long **)_msg.field_2._8_8_ + 0x28))();
    SerializedData::SerializedData((SerializedData *)&ArchiveReader,pData,Size);
    Serializer<(Diligent::SerializerMode)0>::Serializer
              ((Serializer<(Diligent::SerializerMode)0> *)local_68,(SerializedData *)&ArchiveReader)
    ;
    SerializedData::~SerializedData((SerializedData *)&ArchiveReader);
    Header.GitHash = local_68;
    ArchiveHeader::ArchiveHeader((ArchiveHeader *)((long)&_msg_1.field_2 + 8));
    bVar2 = Serializer<(Diligent::SerializerMode)0>::operator()
                      ((Serializer<(Diligent::SerializerMode)0> *)Header.GitHash,
                       (uint *)(_msg_1.field_2._M_local_buf + 8));
    if (bVar2) {
      if (_msg_1.field_2._8_4_ == -0x21fffff6) {
        bVar2 = Serializer<(Diligent::SerializerMode)0>::operator()
                          ((Serializer<(Diligent::SerializerMode)0> *)Header.GitHash,
                           (uint *)(_msg_1.field_2._M_local_buf + 0xc));
        if (bVar2) {
          if (_msg_1.field_2._12_4_ == 8) {
            bVar2 = Serializer<(Diligent::SerializerMode)0>::operator()
                              ((Serializer<(Diligent::SerializerMode)0> *)Header.GitHash,
                               &Header.MagicNumber);
            if (bVar2) {
              bVar2 = Serializer<(Diligent::SerializerMode)0>::operator()
                                ((Serializer<(Diligent::SerializerMode)0> *)Header.GitHash,
                                 &Header.Version);
              if (bVar2) {
                bVar2 = true;
                if (*(int *)(_msg.field_2._8_8_ + 8) != -1) {
                  bVar2 = Header.Version == *(Uint32 *)(_msg.field_2._8_8_ + 8);
                }
                if (bVar2) {
                  Args_1 = (char (*) [16])(ulong)Header.Version;
                  this->m_ContentVersion = Header.Version;
                  bVar2 = Serializer<(Diligent::SerializerMode)0>::operator()
                                    ((Serializer<(Diligent::SerializerMode)0> *)Header.GitHash,
                                     (char **)&Header.APIVersion);
                  if (bVar2) {
                    _msg_9.field_2._12_4_ = 0;
                    bVar2 = Serializer<(Diligent::SerializerMode)0>::operator()
                                      ((Serializer<(Diligent::SerializerMode)0> *)local_68,
                                       (uint *)(_msg_9.field_2._M_local_buf + 0xc));
                    if (bVar2) {
                      for (Name._4_4_ = 0; Name._4_4_ < (uint)_msg_9.field_2._12_4_;
                          Name._4_4_ = Name._4_4_ + 1) {
                        pcStack_1f8 = (char *)0x0;
                        _msg_10.field_2._12_4_ = 0;
                        bVar2 = Serializer<(Diligent::SerializerMode)0>::operator()
                                          ((Serializer<(Diligent::SerializerMode)0> *)local_68,
                                           (ResourceType *)(_msg_10.field_2._M_local_buf + 0xc),
                                           &stack0xfffffffffffffe08);
                        if (!bVar2) {
                          msg.field_2._M_local_buf[0xf] = '.';
                          FormatString<char[46],unsigned_int,char[2],unsigned_int,char>
                                    ((string *)local_220,
                                     (Diligent *)"Failed to read the type and name of resource ",
                                     (char (*) [46])((long)&Name + 4),(uint *)0x474c03,
                                     (char (*) [2])((long)&_msg_9.field_2 + 0xc),
                                     (uint *)(msg.field_2._M_local_buf + 0xf),
                                     in_stack_fffffffffffffc38);
                          puVar1 = DebugMessageCallback;
                          if (DebugMessageCallback != (undefined *)0x0) {
                            uVar3 = std::__cxx11::string::c_str();
                            (*(code *)puVar1)(2,uVar3,0);
                          }
                          std::__cxx11::string::~string((string *)local_220);
                          Clear(this);
                          return false;
                        }
                        if (pcStack_1f8 == (char *)0x0) {
                          FormatString<char[26],char[16]>
                                    ((string *)local_248,(Diligent *)"Debug expression failed:\n",
                                     (char (*) [26])0x46c89a,Args_1);
                          Message = (Char *)std::__cxx11::string::c_str();
                          DebugAssertionFailed
                                    (Message,"Deserialize",
                                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                                     ,0xdd);
                          std::__cxx11::string::~string((string *)local_248);
                        }
                        this_00 = (NamedResourceKey *)((long)&_msg_11.field_2 + 8);
                        Args_1 = (char (*) [16])0x0;
                        NamedResourceKey::NamedResourceKey
                                  (this_00,_msg_10.field_2._12_4_,pcStack_1f8,false);
                        ResData_00 = std::
                                     unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
                                     ::operator[](&this->m_NamedResources,this_00);
                        NamedResourceKey::~NamedResourceKey
                                  ((NamedResourceKey *)((long)&_msg_11.field_2 + 8));
                        bVar2 = anon_unknown_25::ArchiveSerializer<(Diligent::SerializerMode)0>::
                                SerializeResourceData
                                          ((ArchiveSerializer<(Diligent::SerializerMode)0> *)
                                           &Header.GitHash,ResData_00);
                        if (!bVar2) {
                          FormatString<char[34],char_const*,char[3]>
                                    ((string *)&__range1,
                                     (Diligent *)"Failed to read data of resource \'",
                                     (char (*) [34])&stack0xfffffffffffffe08,(char **)"\'.",in_R8);
                          puVar1 = DebugMessageCallback;
                          if (DebugMessageCallback != (undefined *)0x0) {
                            uVar3 = std::__cxx11::string::c_str();
                            (*(code *)puVar1)(2,uVar3,0);
                          }
                          std::__cxx11::string::~string((string *)&__range1);
                          Clear(this);
                          return false;
                        }
                      }
                      __end1 = std::
                               array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
                               ::begin(&this->m_DeviceShaders);
                      pvVar4 = std::
                               array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
                               ::end(&this->m_DeviceShaders);
                      for (; __end1 != pvVar4; __end1 = __end1 + 1) {
                        _msg_12.field_2._8_8_ = __end1;
                        bVar2 = anon_unknown_25::ArchiveSerializer<(Diligent::SerializerMode)0>::
                                SerializeShaders((ArchiveSerializer<(Diligent::SerializerMode)0> *)
                                                 &Header.GitHash,__end1);
                        if (!bVar2) {
                          FormatString<char[59]>
                                    ((string *)local_2d0,
                                     (char (*) [59])
                                     "Failed to read shader data from the device object archive.");
                          puVar1 = DebugMessageCallback;
                          if (DebugMessageCallback != (undefined *)0x0) {
                            uVar3 = std::__cxx11::string::c_str();
                            (*(code *)puVar1)(2,uVar3,0);
                          }
                          std::__cxx11::string::~string((string *)local_2d0);
                          Clear(this);
                          return false;
                        }
                      }
                      this_local._7_1_ = true;
                    }
                    else {
                      FormatString<char[75]>
                                ((string *)local_1e8,
                                 (char (*) [75])
                                 "Failed to read the number of named resources in the device object archive."
                                );
                      puVar1 = DebugMessageCallback;
                      if (DebugMessageCallback != (undefined *)0x0) {
                        uVar3 = std::__cxx11::string::c_str();
                        (*(code *)puVar1)(2,uVar3,0);
                      }
                      std::__cxx11::string::~string((string *)local_1e8);
                      Clear(this);
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    FormatString<char[25]>
                              ((string *)local_1c0,(char (*) [25])"Failed to read Git Hash.");
                    puVar1 = DebugMessageCallback;
                    if (DebugMessageCallback != (undefined *)0x0) {
                      uVar3 = std::__cxx11::string::c_str();
                      (*(code *)puVar1)(2,uVar3,0);
                    }
                    std::__cxx11::string::~string((string *)local_1c0);
                    Clear(this);
                    this_local._7_1_ = false;
                  }
                }
                else {
                  FormatString<char[34],unsigned_int,char[21],unsigned_int>
                            ((string *)((long)&_msg_8.field_2 + 8),
                             (Diligent *)"Invalid archive content version: ",
                             (char (*) [34])&Header.Version,(uint *)". Expected version: ",
                             (char (*) [21])(_msg.field_2._8_8_ + 8),in_R9);
                  puVar1 = DebugMessageCallback;
                  if (DebugMessageCallback != (undefined *)0x0) {
                    uVar3 = std::__cxx11::string::c_str();
                    (*(code *)puVar1)(2,uVar3,0);
                  }
                  std::__cxx11::string::~string((string *)(_msg_8.field_2._M_local_buf + 8));
                  Clear(this);
                  this_local._7_1_ = false;
                }
              }
              else {
                FormatString<char[54]>
                          ((string *)local_170,
                           (char (*) [54])"Failed to read device object archive content version.");
                puVar1 = DebugMessageCallback;
                if (DebugMessageCallback != (undefined *)0x0) {
                  uVar3 = std::__cxx11::string::c_str();
                  (*(code *)puVar1)(2,uVar3,0);
                }
                std::__cxx11::string::~string((string *)local_170);
                Clear(this);
                this_local._7_1_ = false;
              }
            }
            else {
              FormatString<char[37]>
                        ((string *)((long)&_msg_6.field_2 + 8),
                         (char (*) [37])"Failed to read Diligent API version.");
              puVar1 = DebugMessageCallback;
              if (DebugMessageCallback != (undefined *)0x0) {
                uVar3 = std::__cxx11::string::c_str();
                (*(code *)puVar1)(2,uVar3,0);
              }
              std::__cxx11::string::~string((string *)(_msg_6.field_2._M_local_buf + 8));
              Clear(this);
              this_local._7_1_ = false;
            }
          }
          else {
            _msg_5.field_2._12_4_ = 8;
            FormatString<char[44],unsigned_int,char[21],unsigned_int>
                      ((string *)local_128,(Diligent *)"Unsupported device object archive version: "
                       ,(char (*) [44])((long)&_msg_1.field_2 + 0xc),(uint *)". Expected version: ",
                       (char (*) [21])((long)&_msg_5.field_2 + 0xc),in_R9);
            puVar1 = DebugMessageCallback;
            if (DebugMessageCallback != (undefined *)0x0) {
              uVar3 = std::__cxx11::string::c_str();
              (*(code *)puVar1)(2,uVar3,0);
            }
            std::__cxx11::string::~string((string *)local_128);
            Clear(this);
            this_local._7_1_ = false;
          }
        }
        else {
          FormatString<char[46]>
                    ((string *)((long)&_msg_4.field_2 + 8),
                     (char (*) [46])"Failed to read device object archive version.");
          puVar1 = DebugMessageCallback;
          if (DebugMessageCallback != (undefined *)0x0) {
            uVar3 = std::__cxx11::string::c_str();
            (*(code *)puVar1)(2,uVar3,0);
          }
          std::__cxx11::string::~string((string *)(_msg_4.field_2._M_local_buf + 8));
          Clear(this);
          this_local._7_1_ = false;
        }
      }
      else {
        FormatString<char[38]>
                  ((string *)((long)&_msg_3.field_2 + 8),
                   (char (*) [38])"Invalid device object archive header.");
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar3 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(2,uVar3,0);
        }
        std::__cxx11::string::~string((string *)(_msg_3.field_2._M_local_buf + 8));
        Clear(this);
        this_local._7_1_ = false;
      }
    }
    else {
      FormatString<char[58]>
                ((string *)((long)&_msg_2.field_2 + 8),
                 (char (*) [58])"Failed to read device object archive header magic number.");
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar3 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar3,0);
      }
      std::__cxx11::string::~string((string *)(_msg_2.field_2._M_local_buf + 8));
      Clear(this);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DeviceObjectArchive::Deserialize(const CreateInfo& CI) noexcept
{
    Clear();

#define CHECK_ARCHIVE(Expr, ...)            \
    do                                      \
    {                                       \
        if (!(Expr))                        \
        {                                   \
            LOG_ERROR_MESSAGE(__VA_ARGS__); \
            Clear();                        \
            return false;                   \
        }                                   \
    } while (false)

    CHECK_ARCHIVE(CI.pData != nullptr, "pData must not be null");

    m_pArchiveData = CI.MakeCopy ?
        DataBlobImpl::MakeCopy(CI.pData) :
        const_cast<IDataBlob*>(CI.pData); // Need to remove const for AddRef/Release

    Serializer<SerializerMode::Read> Reader{
        SerializedData{
            const_cast<void*>(CI.pData->GetConstDataPtr()),
            CI.pData->GetSize(),
        },
    };
    ArchiveSerializer<SerializerMode::Read> ArchiveReader{Reader};

    // NB: this must match header serialization in DeviceObjectArchive::SerializeHeader
    ArchiveHeader Header;
    ASSERT_SIZEOF64(Header, 24, "Please handle new members here");
    CHECK_ARCHIVE(ArchiveReader.Ser(Header.MagicNumber), "Failed to read device object archive header magic number.");

    CHECK_ARCHIVE(Header.MagicNumber == HeaderMagicNumber, "Invalid device object archive header.");

    CHECK_ARCHIVE(ArchiveReader.Ser(Header.Version), "Failed to read device object archive version.");

    CHECK_ARCHIVE(Header.Version == ArchiveVersion, "Unsupported device object archive version: ", Header.Version, ". Expected version: ", Uint32{ArchiveVersion});

    CHECK_ARCHIVE(ArchiveReader.Ser(Header.APIVersion), "Failed to read Diligent API version.");

    CHECK_ARCHIVE(ArchiveReader.Ser(Header.ContentVersion), "Failed to read device object archive content version.");

    CHECK_ARCHIVE(CI.ContentVersion == CreateInfo{}.ContentVersion || Header.ContentVersion == CI.ContentVersion,
                  "Invalid archive content version: ", Header.ContentVersion, ". Expected version: ", CI.ContentVersion);
    m_ContentVersion = Header.ContentVersion;

    CHECK_ARCHIVE(ArchiveReader.Ser(Header.GitHash), "Failed to read Git Hash.");

    Uint32 NumResources = 0;
    CHECK_ARCHIVE(Reader(NumResources), "Failed to read the number of named resources in the device object archive.");

    for (Uint32 res = 0; res < NumResources; ++res)
    {
        const char*  Name    = nullptr;
        ResourceType ResType = ResourceType::Undefined;
        CHECK_ARCHIVE(Reader(ResType, Name), "Failed to read the type and name of resource ", res, "/", NumResources, '.');
        VERIFY_EXPR(Name != nullptr);

        // No need to make the name copy as we keep the source data blob alive.
        constexpr bool MakeNameCopy = false;
        ResourceData&  ResData      = m_NamedResources[NamedResourceKey{ResType, Name, MakeNameCopy}];

        CHECK_ARCHIVE(ArchiveReader.SerializeResourceData(ResData), "Failed to read data of resource '", Name, "'.");
    }

    for (std::vector<SerializedData>& Shaders : m_DeviceShaders)
    {
        CHECK_ARCHIVE(ArchiveReader.SerializeShaders(Shaders), "Failed to read shader data from the device object archive.");
    }
#undef CHECK_ARCHIVE

    return true;
}